

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

void __thiscall
CCallMethodExp::CCallMethodExp
          (CCallMethodExp *this,IExpression *_objectExpression,CIdExp *_methodName,CExpList *_args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_0017a308;
  (this->objectExpression)._M_t.
  super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  (this->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = (CIdExp *)0x0;
  (this->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
  super__Head_base<0UL,_CExpList_*,_false>._M_head_impl = (CExpList *)0x0;
  iVar1 = (_methodName->super_IExpression).super_PositionedNode.position.lastLine;
  iVar2 = (_methodName->super_IExpression).super_PositionedNode.position.firstColumn;
  iVar3 = (_methodName->super_IExpression).super_PositionedNode.position.lastColumn;
  (this->super_IExpression).super_PositionedNode.position.firstLine =
       (_methodName->super_IExpression).super_PositionedNode.position.firstLine;
  (this->super_IExpression).super_PositionedNode.position.lastLine = iVar1;
  (this->super_IExpression).super_PositionedNode.position.firstColumn = iVar2;
  (this->super_IExpression).super_PositionedNode.position.lastColumn = iVar3;
  (this->objectExpression)._M_t.
  super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = _objectExpression;
  (this->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = _methodName;
  (this->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
  super__Head_base<0UL,_CExpList_*,_false>._M_head_impl = _args;
  return;
}

Assistant:

CCallMethodExp::CCallMethodExp( IExpression* _objectExpression, CIdExp *_methodName, CExpList *_args ) {
    this->position = _methodName->position;
    objectExpression = std::unique_ptr<IExpression>(_objectExpression);
    methodName = std::unique_ptr<CIdExp>( _methodName );
    args = std::unique_ptr<CExpList>( _args );
}